

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O2

void __thiscall cmFileAPI::WriteReplies(cmFileAPI *this)

{
  allocator<char> local_79;
  Value local_78;
  string local_50;
  string local_30;
  
  if (this->QueryExists == true) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78,
                   &this->APIv1,"/reply");
    cmsys::SystemTools::MakeDirectory((string *)&local_78,(mode_t *)0x0);
    std::__cxx11::string::~string((string *)&local_78);
    BuildReplyIndex(&local_78,this);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"index",&local_79);
    WriteJsonFile(&local_30,this,&local_78,&local_50,ComputeSuffixTime);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    Json::Value::~Value(&local_78);
  }
  RemoveOldReplyFiles(this);
  return;
}

Assistant:

void cmFileAPI::WriteReplies()
{
  if (this->QueryExists) {
    cmSystemTools::MakeDirectory(this->APIv1 + "/reply");
    this->WriteJsonFile(this->BuildReplyIndex(), "index", ComputeSuffixTime);
  }

  this->RemoveOldReplyFiles();
}